

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManifestTest.cpp
# Opt level: O1

string * normalize(string *__return_storage_ptr__,string *workingDirectory,string *path0)

{
  bool bVar1;
  SmallVectorImpl<char> *in_RCX;
  char *pcVar2;
  char *pcVar3;
  StringRef workingDirectory_00;
  SmallString<256U> absPathTmp;
  SmallVectorImpl<char> local_138;
  char local_128 [256];
  
  pcVar3 = (path0->_M_dataplus)._M_p;
  local_138.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  local_138.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x100;
  local_138.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = local_128;
  llvm::SmallVectorImpl<char>::append<char_const*,void>
            (&local_138,pcVar3,pcVar3 + path0->_M_string_length);
  workingDirectory_00.Length = (size_t)&local_138;
  workingDirectory_00.Data = (char *)workingDirectory->_M_string_length;
  bVar1 = llbuild::ninja::Manifest::normalize_path
                    ((Manifest *)(workingDirectory->_M_dataplus)._M_p,workingDirectory_00,in_RCX);
  if (bVar1) {
    if (workingDirectory->_M_string_length + path0->_M_string_length + 2 <=
        (local_138.super_SmallVectorTemplateBase<char,_true>.
         super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase._8_8_ & 0xffffffff)) {
      __assert_fail("absPathTmp.size() < workingDirectory.size() + 1 + path0.size() + 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Ninja/ManifestTest.cpp"
                    ,0x1c,"std::string normalize(std::string, std::string)");
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((char *)local_138.super_SmallVectorTemplateBase<char,_true>.
                super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX ==
        (char *)0x0) {
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      goto LAB_0011bc09;
    }
    pcVar2 = (char *)((long)local_138.super_SmallVectorTemplateBase<char,_true>.
                            super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX
                     + (local_138.super_SmallVectorTemplateBase<char,_true>.
                        super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase._8_8_ &
                       0xffffffff));
    pcVar3 = (char *)local_138.super_SmallVectorTemplateBase<char,_true>.
                     super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "<failed to normalize>";
    pcVar2 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
LAB_0011bc09:
  if ((char *)local_138.super_SmallVectorTemplateBase<char,_true>.
              super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX != local_128)
  {
    free(local_138.super_SmallVectorTemplateBase<char,_true>.
         super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string normalize(std::string workingDirectory, std::string path0) {
  SmallString<256> absPathTmp = StringRef(path0);
  if (!Manifest::normalize_path(workingDirectory, absPathTmp)) {
    return "<failed to normalize>";
  }
  assert(absPathTmp.size() < workingDirectory.size() + 1 + path0.size() + 1);
  return absPathTmp.str();
}